

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cv.c
# Opt level: O0

int __thiscall
nsync::nsync_cv_wait_with_deadline_generic
          (nsync *this,nsync_cv *pcv,void *pmu,_func_void_void_ptr *lock,_func_void_void_ptr *unlock
          ,nsync_time abs_deadline,nsync_note cancel_note)

{
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  waiter *w_00;
  nsync_dll_list_ pnVar6;
  nsync_note cancel_note_00;
  bool bVar7;
  nsync_time abs_deadline_00;
  uint32_t old_value;
  int is_reader;
  int is_writer;
  uint32_t old_mu_word;
  waiter *w;
  int outcome;
  uint attempts;
  int sem_outcome;
  uint32_t remove_count;
  uint32_t old_word;
  int is_reader_mu;
  nsync_mu *cv_mu;
  _func_void_void_ptr *unlock_local;
  _func_void_void_ptr *lock_local;
  void *pmu_local;
  nsync_cv *pcv_local;
  nsync_time abs_deadline_local;
  
  _old_word = (nsync_cv *)0x0;
  w._0_4_ = 0;
  cancel_note_00 = (nsync_note)unlock;
  w_00 = nsync_waiter_new_();
  std::atomic_store_explicit<unsigned_int>(&(w_00->nw).waiting,1,memory_order_relaxed);
  (w_00->cond).f = (_func_int_void_ptr *)0x0;
  (w_00->cond).v = (void *)0x0;
  (w_00->cond).eq = (_func_int_void_ptr_void_ptr *)0x0;
  if ((((code *)pmu == void_mu_lock) || ((code *)pmu == nsync_mu_lock)) ||
     ((code *)pmu == nsync_mu_rlock)) {
    _old_word = pcv;
  }
  w_00->cv_mu = (nsync_mu_s_ *)_old_word;
  bVar1 = false;
  if (_old_word == (nsync_cv *)0x0) {
    w_00->l_type = (lock_type *)0x0;
  }
  else {
    uVar3 = std::atomic_load_explicit<unsigned_int>(&_old_word->word,memory_order_relaxed);
    bVar7 = (uVar3 & 0xffffff00) != 0;
    if ((uVar3 & 1) == 0) {
      bVar1 = !bVar7;
      if (bVar1) {
        nsync_panic_("mu not held on entry to nsync_cv_wait_with_deadline()\n");
      }
      else {
        w_00->l_type = (lock_type *)nsync_reader_type_;
      }
      bVar1 = !bVar1;
    }
    else {
      if (bVar7) {
        nsync_panic_(
                    "mu held in reader and writer mode simultaneously on entry to nsync_cv_wait_with_deadline()\n"
                    );
      }
      w_00->l_type = (lock_type *)nsync_writer_type_;
    }
  }
  uVar2 = nsync_spin_test_and_set_((nsync_atomic_uint32_ *)this,1,3,0);
  pnVar6 = nsync_dll_make_last_in_list_(*(nsync_dll_list_ *)(this + 8),&(w_00->nw).q);
  *(nsync_dll_list_ *)(this + 8) = pnVar6;
  uVar3 = std::atomic_load_explicit<unsigned_int>(&w_00->remove_count,memory_order_relaxed);
  std::atomic_store_explicit<unsigned_int>
            ((atomic<unsigned_int> *)this,uVar2 | 2,memory_order_release);
  if (bVar1) {
    nsync_mu_runlock((nsync_mu *)_old_word);
  }
  else {
    (*lock)(pcv);
  }
  outcome = 0;
  w._4_4_ = 0;
  while (uVar4 = std::atomic_load_explicit<unsigned_int>(&(w_00->nw).waiting,memory_order_acquire),
        uVar4 != 0) {
    if (outcome == 0) {
      abs_deadline_00.tv_nsec = abs_deadline.tv_sec;
      abs_deadline_00.tv_sec = (__time_t)cancel_note;
      outcome = nsync_sem_wait_with_cancel_
                          ((nsync *)w_00,(waiter *)unlock,abs_deadline_00,cancel_note_00);
    }
    if ((outcome != 0) &&
       (uVar4 = std::atomic_load_explicit<unsigned_int>(&(w_00->nw).waiting,memory_order_relaxed),
       uVar4 != 0)) {
      sem_outcome = nsync_spin_test_and_set_((nsync_atomic_uint32_ *)this,1,1,0);
      uVar4 = std::atomic_load_explicit<unsigned_int>(&(w_00->nw).waiting,memory_order_relaxed);
      if ((uVar4 != 0) &&
         (uVar4 = std::atomic_load_explicit<unsigned_int>(&w_00->remove_count,memory_order_relaxed),
         uVar3 == uVar4)) {
        w._0_4_ = outcome;
        pnVar6 = nsync_dll_remove_(*(nsync_dll_list_ *)(this + 8),&(w_00->nw).q);
        *(nsync_dll_list_ *)(this + 8) = pnVar6;
        do {
          uVar4 = std::atomic_load_explicit<unsigned_int>(&w_00->remove_count,memory_order_relaxed);
          iVar5 = atm_cas_nomb_u32_(&w_00->remove_count,uVar4,uVar4 + 1);
        } while (iVar5 == 0);
        iVar5 = nsync_dll_is_empty_(*(nsync_dll_list_ *)(this + 8));
        if (iVar5 != 0) {
          sem_outcome = sem_outcome & 0xfffffffd;
        }
        std::atomic_store_explicit<unsigned_int>(&(w_00->nw).waiting,0,memory_order_release);
      }
      std::atomic_store_explicit<unsigned_int>
                ((atomic<unsigned_int> *)this,sem_outcome,memory_order_release);
    }
    uVar4 = std::atomic_load_explicit<unsigned_int>(&(w_00->nw).waiting,memory_order_relaxed);
    if (uVar4 != 0) {
      w._4_4_ = nsync_spin_delay_(w._4_4_);
    }
  }
  if ((_old_word == (nsync_cv *)0x0) || (w_00->cv_mu != (nsync_mu_s_ *)0x0)) {
    nsync_waiter_free_(w_00);
    if (bVar1) {
      nsync_mu_rlock((nsync_mu *)_old_word);
    }
    else {
      (*(code *)pmu)(pcv);
    }
  }
  else {
    nsync_mu_lock_slow_((nsync_mu *)_old_word,w_00,8,w_00->l_type);
    nsync_waiter_free_(w_00);
  }
  return (int)w;
}

Assistant:

int nsync_cv_wait_with_deadline_generic (nsync_cv *pcv, void *pmu,
					 void (*lock) (void *), void (*unlock) (void *),
					 nsync_time abs_deadline,
					 nsync_note cancel_note) {
	nsync_mu *cv_mu = NULL;
	int is_reader_mu;
	uint32_t old_word;
	uint32_t remove_count;
	int sem_outcome;
	unsigned attempts;
	int outcome = 0;
	waiter *w;
	IGNORE_RACES_START ();
	w = nsync_waiter_new_ ();
	ATM_STORE (&w->nw.waiting, 1);
	w->cond.f = NULL; /* Not using a conditional critical section. */
	w->cond.v = NULL;
	w->cond.eq = NULL;
	if (lock == &void_mu_lock ||
	    lock == (void (*) (void *)) &nsync_mu_lock ||
	    lock == (void (*) (void *)) &nsync_mu_rlock) {
		cv_mu = (nsync_mu *) pmu;
	}
	w->cv_mu = cv_mu;       /* If *pmu is an nsync_mu, record its address, else record NULL. */
	is_reader_mu = 0; /* If true, an nsync_mu in reader mode. */
	if (cv_mu == NULL) {
		w->l_type = NULL;
	} else {
		uint32_t old_mu_word = ATM_LOAD (&cv_mu->word);
		int is_writer = (old_mu_word & MU_WHELD_IF_NON_ZERO) != 0;
		int is_reader = (old_mu_word & MU_RHELD_IF_NON_ZERO) != 0;
		if (is_writer) {
			if (is_reader) {
				nsync_panic_ ("mu held in reader and writer mode simultaneously "
				       "on entry to nsync_cv_wait_with_deadline()\n");
			}
			w->l_type = nsync_writer_type_;
		} else if (is_reader) {
			w->l_type = nsync_reader_type_;
			is_reader_mu = 1;
		} else {
			nsync_panic_ ("mu not held on entry to nsync_cv_wait_with_deadline()\n");
		}
	}

	/* acquire spinlock, set non-empty */
	old_word = nsync_spin_test_and_set_ (&pcv->word, CV_SPINLOCK, CV_SPINLOCK|CV_NON_EMPTY, 0);
	pcv->waiters = nsync_dll_make_last_in_list_ (pcv->waiters, &w->nw.q);
	remove_count = ATM_LOAD (&w->remove_count);
	/* Release the spin lock. */
	ATM_STORE_REL (&pcv->word, old_word|CV_NON_EMPTY); /* release store */

	/* Release *pmu. */
	if (is_reader_mu) {
		nsync_mu_runlock (cv_mu);
	} else {
		(*unlock) (pmu);
	}

	/* wait until awoken or a timeout. */
	sem_outcome = 0;
	attempts = 0;
	while (ATM_LOAD_ACQ (&w->nw.waiting) != 0) { /* acquire load */
		if (sem_outcome == 0) {
			sem_outcome = nsync_sem_wait_with_cancel_ (w, abs_deadline, cancel_note);
		}

		if (sem_outcome != 0 && ATM_LOAD (&w->nw.waiting) != 0) {
			/* A timeout or cancellation occurred, and no wakeup.
			   Acquire *pcv's spinlock, and confirm.  */
			old_word = nsync_spin_test_and_set_ (&pcv->word, CV_SPINLOCK,
							     CV_SPINLOCK, 0);
			/* Check that w wasn't removed from the queue after we
			   checked above, but before we acquired the spinlock.
			   The test of remove_count confirms that the waiter *w
			   is still governed by *pcv's spinlock; otherwise, some
			   other thread is about to set w.waiting==0.  */
			if (ATM_LOAD (&w->nw.waiting) != 0) {
				if (remove_count == ATM_LOAD (&w->remove_count)) {
					uint32_t old_value;
					/* still in cv waiter queue */
					/* Not woken, so remove *w from cv
					   queue, and declare a
					   timeout/cancellation.  */
					outcome = sem_outcome;
					pcv->waiters = nsync_dll_remove_ (pcv->waiters,
								          &w->nw.q);
					do {    
						old_value = ATM_LOAD (&w->remove_count);
					} while (!ATM_CAS (&w->remove_count, old_value, old_value+1));
					if (nsync_dll_is_empty_ (pcv->waiters)) {
						old_word &= ~(CV_NON_EMPTY);
					}
					ATM_STORE_REL (&w->nw.waiting, 0); /* release store */
				}
			}
			/* Release spinlock. */
			ATM_STORE_REL (&pcv->word, old_word); /* release store */
		}

		if (ATM_LOAD (&w->nw.waiting) != 0) {
                        /* The delay here causes this thread ultimately to
                           yield to another that has dequeued this thread, but
                           has not yet set the waiting field to zero; a
                           cancellation or timeout may prevent this thread
                           from blocking above on the semaphore.  */
			attempts = nsync_spin_delay_ (attempts);
		}
	}

	if (cv_mu != NULL && w->cv_mu == NULL) { /* waiter was moved to *pmu's queue, and woken. */
		/* Requeue on *pmu using existing waiter struct; current thread
		   is the designated waker.  */
		nsync_mu_lock_slow_ (cv_mu, w, MU_DESIG_WAKER, w->l_type);
		RWLOCK_TRYACQUIRE (1, cv_mu, w->l_type == nsync_writer_type_);
		nsync_waiter_free_ (w);
	} else {
		/* Traditional case: We've woken from the cv, and need to reacquire *pmu. */
		nsync_waiter_free_ (w);
		if (is_reader_mu) {
			nsync_mu_rlock (cv_mu);
		} else {
			(*lock) (pmu);
		}
	}
	IGNORE_RACES_END ();
	return (outcome);
}